

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O3

QImage * __thiscall
QFontEngine::alphaRGBMapForGlyph
          (QImage *__return_storage_ptr__,QFontEngine *this,glyph_t glyph,QFixedPoint *param_2,
          QTransform *t)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  uchar *puVar4;
  undefined4 in_register_00000014;
  long lVar5;
  long in_FS_OFFSET;
  QImage local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.super_QPaintDevice._vptr_QPaintDevice._0_4_ = 0xaaaaaaaa;
  local_58.super_QPaintDevice._vptr_QPaintDevice._4_4_ = 0xaaaaaaaa;
  local_58.super_QPaintDevice.painters = 0xaaaa;
  local_58.super_QPaintDevice._10_2_ = 0xaaaa;
  local_58.super_QPaintDevice._12_4_ = 0xaaaaaaaa;
  (*this->_vptr_QFontEngine[0x13])(&local_58,this,CONCAT44(in_register_00000014,glyph),t);
  __return_storage_ptr__->d = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->super_QPaintDevice)._vptr_QPaintDevice =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(__return_storage_ptr__->super_QPaintDevice).painters = &DAT_aaaaaaaaaaaaaaaa;
  iVar1 = QImage::width(&local_58);
  iVar2 = QImage::height(&local_58);
  QImage::QImage(__return_storage_ptr__,iVar1,iVar2,Format_RGB32);
  iVar1 = QImage::height(&local_58);
  if (0 < iVar1) {
    iVar1 = 0;
    do {
      puVar3 = QImage::scanLine(__return_storage_ptr__,iVar1);
      puVar4 = QImage::constScanLine(&local_58,iVar1);
      iVar2 = QImage::width(&local_58);
      if (0 < iVar2) {
        lVar5 = 0;
        do {
          *(uint *)(puVar3 + lVar5 * 4) = (uint)puVar4[lVar5] * 0x10101 | 0xff000000;
          lVar5 = lVar5 + 1;
          iVar2 = QImage::width(&local_58);
        } while (lVar5 < iVar2);
      }
      iVar1 = iVar1 + 1;
      iVar2 = QImage::height(&local_58);
    } while (iVar1 < iVar2);
  }
  QImage::~QImage(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QImage QFontEngine::alphaRGBMapForGlyph(glyph_t glyph, const QFixedPoint &/*subPixelPosition*/, const QTransform &t)
{
    const QImage alphaMask = alphaMapForGlyph(glyph, t);
    QImage rgbMask(alphaMask.width(), alphaMask.height(), QImage::Format_RGB32);

    for (int y=0; y<alphaMask.height(); ++y) {
        uint *dst = (uint *) rgbMask.scanLine(y);
        const uchar *src = alphaMask.constScanLine(y);
        for (int x=0; x<alphaMask.width(); ++x) {
            int val = src[x];
            dst[x] = qRgb(val, val, val);
        }
    }

    return rgbMask;
}